

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_time.cpp
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  long lVar6;
  double dVar7;
  ptime l;
  ptime l_00;
  ptime h;
  ptime h_00;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  tm t_ref;
  ostringstream oss;
  ptime local_288;
  tm local_278;
  tm local_240 [6];
  tm local_c8;
  string local_90 [32];
  ptime local_70;
  ptime local_60;
  ptime local_50;
  ptime local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Testing ptime",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  local_288.sec = 0;
  local_288.nsec = 0;
  booster::ptime::normalize(&local_288);
  if ((local_288.sec != booster::ptime::zero) || (local_288.nsec != _Init)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," p==ptime::zero",0xf);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_288.sec != 0) || (local_288.nsec != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==0 && p.get_nanoseconds()==0",0x2d);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 10;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0x14;
  booster::ptime::normalize((ptime *)local_240);
  local_288.nsec = local_240[0].tm_hour;
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_240[0].tm_sec = 10;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0x14;
  booster::ptime::normalize((ptime *)local_240);
  if ((local_288.sec != local_240[0]._0_8_) || (local_288.nsec != local_240[0].tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," p==ptime(10,20)",0x10);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_288.sec != 10) || (local_288.nsec != 0x14)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==10 && p.get_nanoseconds()==20",0x2f);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 0xf;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  local_288.nsec = local_240[0].tm_hour;
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_240[0].tm_sec = 0xf;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  if ((local_288.sec != local_240[0]._0_8_) || (local_288.nsec != local_240[0].tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," p==ptime(15,0)",0xf);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_288.sec != 0xf) || (local_288.nsec != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==15 && p.get_nanoseconds()==0",0x2e);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 2;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 100000000;
  booster::ptime::normalize((ptime *)local_240);
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_288.nsec = local_240[0].tm_hour;
  if ((local_240[0]._0_8_ != 2) || (local_240[0].tm_hour != 100000000)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==2 && p.get_nanoseconds() == 100000000",0x37);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 3;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 230000000;
  booster::ptime::normalize((ptime *)local_240);
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_288.nsec = local_240[0].tm_hour;
  if ((local_240[0]._0_8_ != 3) || (local_240[0].tm_hour != 230000000)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds() == 3 && p.get_nanoseconds() == 230000000",0x39);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 1;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 100;
  booster::ptime::normalize((ptime *)local_240);
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_288.nsec = local_240[0].tm_hour;
  if ((local_240[0]._0_8_ != 1) || (local_240[0].tm_hour != 100)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==1 && p.get_nanoseconds() == 100",0x31);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 0xf;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_288.nsec = local_240[0].tm_hour;
  local_240[0].tm_sec = 0xf;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  if (((local_288.sec != local_240[0]._0_8_) || (local_288.nsec != local_240[0].tm_hour)) ||
     (local_288.sec != 0xf)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p==ptime(15) && ptime::seconds(p)==15",0x26);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 900;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_288.nsec = local_240[0].tm_hour;
  local_240[0].tm_sec = 900;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  if (((local_288.sec != local_240[0]._0_8_) || (local_288.nsec != local_240[0].tm_hour)) ||
     (0x3b < local_288.sec - 900U)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p==ptime(15*60) && ptime::minutes(p)==15",0x29);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 54000;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_288.nsec = local_240[0].tm_hour;
  local_240[0].tm_sec = 54000;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  if (((local_288.sec != local_240[0]._0_8_) || (local_288.nsec != local_240[0].tm_hour)) ||
     (0xe0f < local_288.sec - 54000U)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p==ptime(15*3600) && ptime::hours(p)==15",0x29);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 0x13c680;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  local_288.nsec = local_240[0].tm_hour;
  local_240[0].tm_sec = 0x13c680;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  if (((local_288.sec != local_240[0]._0_8_) || (local_288.nsec != local_240[0].tm_hour)) ||
     (0x1517f < local_288.sec - 0x13c680U)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p==ptime(15*3600*24) && ptime::days(p)==15",0x2b);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0x3b9aca01;
  booster::ptime::normalize((ptime *)local_240);
  local_288.nsec = local_240[0].tm_hour;
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  if ((local_240[0]._0_8_ != 0x65) || (local_240[0].tm_hour != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==101 && p.get_nanoseconds()==1",0x2f);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0x77359401;
  booster::ptime::normalize((ptime *)local_240);
  local_288.nsec = local_240[0].tm_hour;
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  if ((local_240[0]._0_8_ != 0x66) || (local_240[0].tm_hour != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==102 && p.get_nanoseconds()==1",0x2f);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 2000000000;
  booster::ptime::normalize((ptime *)local_240);
  local_288.nsec = local_240[0].tm_hour;
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  if ((local_240[0]._0_8_ != 0x66) || (local_240[0].tm_hour != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x45);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==102 && p.get_nanoseconds()==0",0x2f);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = -999999999;
  booster::ptime::normalize((ptime *)local_240);
  local_288.nsec = local_240[0].tm_hour;
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  if ((local_240[0]._0_8_ != 99) || (local_240[0].tm_hour != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x48);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==99 && p.get_nanoseconds()==1",0x2e);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = -0x773593fe;
  booster::ptime::normalize((ptime *)local_240);
  local_288.nsec = local_240[0].tm_hour;
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  if ((local_240[0]._0_8_ != 0x62) || (local_240[0].tm_hour != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," p.get_seconds()==98 && p.get_nanoseconds()==2",0x2e);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 0;
  booster::ptime::normalize((ptime *)local_240);
  local_278.tm_sec = 0x65;
  local_278.tm_min = 0;
  local_278.tm_hour = 0;
  booster::ptime::normalize((ptime *)&local_278);
  if ((local_240[0]._0_8_ == local_278._0_8_) && (local_240[0].tm_hour == local_278.tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ptime(100,0)!=ptime(101,0)",0x1b);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 1;
  booster::ptime::normalize((ptime *)local_240);
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 0;
  booster::ptime::normalize((ptime *)&local_278);
  if ((local_240[0]._0_8_ == local_278._0_8_) && (local_240[0].tm_hour == local_278.tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x4e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ptime(100,1)!=ptime(100,0)",0x1b);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 0x65;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 1;
  booster::ptime::normalize((ptime *)local_240);
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 0;
  booster::ptime::normalize((ptime *)&local_278);
  if ((local_240[0]._0_8_ == local_278._0_8_) && (local_240[0].tm_hour == local_278.tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ptime(101,1)!=ptime(100,0)",0x1b);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 3;
  booster::ptime::normalize((ptime *)local_240);
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 3;
  booster::ptime::normalize((ptime *)&local_278);
  if ((local_240[0]._0_8_ != local_278._0_8_) || (local_240[0].tm_hour != local_278.tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ptime(100,3)==ptime(100,3)",0x1b);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 3;
  booster::ptime::normalize((ptime *)local_240);
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 3;
  booster::ptime::normalize((ptime *)&local_278);
  if (((long)local_278._0_8_ < (long)local_240[0]._0_8_) ||
     (((long)local_278._0_8_ <= (long)local_240[0]._0_8_ &&
      (local_278.tm_hour < local_240[0].tm_hour)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ptime(100,3)<=ptime(100,3)",0x1b);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240[0].tm_sec = 100;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 3;
  booster::ptime::normalize((ptime *)local_240);
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 3;
  booster::ptime::normalize((ptime *)&local_278);
  if (((long)local_240[0]._0_8_ < (long)local_278._0_8_) ||
     (((long)local_240[0]._0_8_ <= (long)local_278._0_8_ &&
      (local_240[0].tm_hour < local_278.tm_hour)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ptime(100,3)>=ptime(100,3)",0x1b);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 2;
  booster::ptime::normalize((ptime *)&local_278);
  local_c8.tm_sec = 0x65;
  local_c8.tm_min = 0;
  local_c8.tm_hour = 3;
  booster::ptime::normalize((ptime *)&local_c8);
  local_240[0]._0_8_ = local_c8._0_8_ + local_278._0_8_;
  local_240[0].tm_hour = local_c8.tm_hour + local_278.tm_hour;
  booster::ptime::normalize((ptime *)local_240);
  iVar2 = local_240[0].tm_hour;
  uVar1 = local_240[0]._0_8_;
  local_240[0].tm_sec = 0xc9;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 5;
  booster::ptime::normalize((ptime *)local_240);
  if ((uVar1 != local_240[0]._0_8_) || (iVar2 != local_240[0].tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x54);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," ptime(100,2)+ptime(101,3)==ptime(201,5)",0x28);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 2;
  booster::ptime::normalize((ptime *)&local_278);
  local_c8.tm_sec = 1;
  local_c8.tm_min = 0;
  local_c8.tm_hour = 999999999;
  booster::ptime::normalize((ptime *)&local_c8);
  local_240[0]._0_8_ = local_c8._0_8_ + local_278._0_8_;
  local_240[0].tm_hour = local_c8.tm_hour + local_278.tm_hour;
  booster::ptime::normalize((ptime *)local_240);
  iVar2 = local_240[0].tm_hour;
  uVar1 = local_240[0]._0_8_;
  local_240[0].tm_sec = 0x66;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 1;
  booster::ptime::normalize((ptime *)local_240);
  if ((uVar1 != local_240[0]._0_8_) || (iVar2 != local_240[0].tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x55);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," ptime(100,2)+ptime(1,999999999)==ptime(102,1)",0x2e);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 0;
  booster::ptime::normalize((ptime *)&local_278);
  local_c8.tm_sec = 1;
  local_c8.tm_min = 0;
  local_c8.tm_hour = 1;
  booster::ptime::normalize((ptime *)&local_c8);
  local_240[0]._0_8_ = local_278._0_8_ - local_c8._0_8_;
  local_240[0].tm_hour = local_278.tm_hour - local_c8.tm_hour;
  booster::ptime::normalize((ptime *)local_240);
  iVar2 = local_240[0].tm_hour;
  uVar1 = local_240[0]._0_8_;
  local_240[0].tm_sec = 0x62;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 999999999;
  booster::ptime::normalize((ptime *)local_240);
  if ((uVar1 != local_240[0]._0_8_) || (iVar2 != local_240[0].tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x56);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," ptime(100,0)-ptime(1,1)==ptime(98,999999999)",0x2d);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 0;
  booster::ptime::normalize((ptime *)&local_278);
  local_c8.tm_sec = 0;
  local_c8.tm_min = 0;
  local_c8.tm_hour = 999999999;
  booster::ptime::normalize((ptime *)&local_c8);
  local_240[0]._0_8_ = local_278._0_8_ - local_c8._0_8_;
  local_240[0].tm_hour = local_278.tm_hour - local_c8.tm_hour;
  booster::ptime::normalize((ptime *)local_240);
  iVar2 = local_240[0].tm_hour;
  uVar1 = local_240[0]._0_8_;
  local_240[0].tm_sec = 99;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 1;
  booster::ptime::normalize((ptime *)local_240);
  if ((uVar1 != local_240[0]._0_8_) || (iVar2 != local_240[0].tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x57);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," ptime(100,0)-ptime(0,999999999)==ptime(99,1)",0x2d);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_278.tm_sec = 100;
  local_278.tm_min = 0;
  local_278.tm_hour = 10;
  booster::ptime::normalize((ptime *)&local_278);
  local_c8.tm_sec = 1;
  local_c8.tm_min = 0;
  local_c8.tm_hour = 5;
  booster::ptime::normalize((ptime *)&local_c8);
  local_240[0]._0_8_ = local_278._0_8_ - local_c8._0_8_;
  local_240[0].tm_hour = local_278.tm_hour - local_c8.tm_hour;
  booster::ptime::normalize((ptime *)local_240);
  iVar2 = local_240[0].tm_hour;
  uVar1 = local_240[0]._0_8_;
  local_240[0].tm_sec = 99;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 5;
  booster::ptime::normalize((ptime *)local_240);
  if ((uVar1 != local_240[0]._0_8_) || (iVar2 != local_240[0].tm_hour)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x58);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," ptime(100,10)-ptime(1,5)==ptime(99,5)",0x26);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_40.sec = 100;
  local_40.nsec = 0;
  booster::ptime::normalize(&local_40);
  local_50.sec = 0x65;
  local_50.nsec = 0;
  booster::ptime::normalize(&local_50);
  l.nsec = local_40.nsec;
  l.sec = local_40.sec;
  h.nsec = local_50.nsec;
  h.sec = local_50.sec;
  l._12_4_ = 0;
  h._12_4_ = 0;
  test_lower(l,h);
  local_60.sec = 100;
  local_60.nsec = 0;
  booster::ptime::normalize(&local_60);
  local_70.sec = 100;
  local_70.nsec = 1;
  booster::ptime::normalize(&local_70);
  l_00.nsec = local_60.nsec;
  l_00.sec = local_60.sec;
  h_00.nsec = local_70.nsec;
  h_00.sec = local_70.sec;
  l_00._12_4_ = 0;
  h_00._12_4_ = 0;
  test_lower(l_00,h_00);
  local_240[0].tm_sec = 10;
  local_240[0].tm_min = 0;
  local_240[0].tm_hour = 100000000;
  booster::ptime::normalize((ptime *)local_240);
  local_288.nsec = local_240[0].tm_hour;
  local_288.sec._0_4_ = local_240[0].tm_sec;
  local_288.sec._4_4_ = local_240[0].tm_min;
  dVar7 = (double)local_240[0].tm_hour * 1e-09 + (double)(long)local_240[0]._0_8_;
  if ((10.099999 < dVar7) && (dVar7 < 10.10001)) {
    local_278.tm_sec = 10;
    local_278.tm_min = 0;
    local_278.tm_hour = 0x989676;
    booster::ptime::normalize((ptime *)&local_278);
    local_240[0].tm_sec = 10;
    local_240[0].tm_min = 0;
    local_240[0].tm_hour = 99999999;
    booster::ptime::normalize((ptime *)local_240);
    if (((long)local_278._0_8_ < (long)local_240[0]._0_8_) ||
       (((long)local_278._0_8_ <= (long)local_240[0]._0_8_ &&
        (local_278.tm_hour < local_240[0].tm_hour)))) {
      local_240[0].tm_sec = 10;
      local_240[0].tm_min = 0;
      local_240[0].tm_hour = 99999999;
      booster::ptime::normalize((ptime *)local_240);
      iVar2 = local_240[0].tm_hour;
      uVar1 = local_240[0]._0_8_;
      local_c8.tm_sec = 10;
      local_c8.tm_min = 0;
      local_c8.tm_hour = 0x5f5e10a;
      booster::ptime::normalize((ptime *)&local_c8);
      if (((long)uVar1 < (long)local_c8._0_8_) ||
         (((long)uVar1 <= (long)local_c8._0_8_ && (iVar2 < local_c8.tm_hour)))) {
        auVar8 = booster::ptime::now();
        local_240[0].tm_sec = 0;
        local_240[0].tm_min = 0;
        local_240[0].tm_hour = 100000000;
        booster::ptime::normalize((ptime *)local_240);
        local_278.tm_sec = local_240[0].tm_sec;
        local_278.tm_min = local_240[0].tm_min;
        local_278.tm_hour = local_240[0].tm_hour;
        booster::ptime::sleep((ptime *)&local_278);
        auVar9 = booster::ptime::now();
        local_240[0]._0_8_ = auVar9._0_8_ - auVar8._0_8_;
        local_240[0].tm_hour = auVar9._8_4_ - auVar8._8_4_;
        booster::ptime::normalize((ptime *)local_240);
        if (200 < (local_240[0].tm_sec * 1000 + local_240[0].tm_hour / 1000000) - 100U) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,100);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," 100 <= diff && diff <=300",0x1a);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&local_278);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"- Testing ctime",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"- Testing timegm normalization",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        local_278.tm_hour = 0;
        local_278.tm_mday = 0xe;
        local_278.tm_mon = 0xe;
        local_278.tm_year = 0x6f;
        local_278.tm_sec = 0;
        local_278.tm_min = 0;
        local_278.tm_wday = 0;
        local_278.tm_yday = 0;
        local_278.tm_isdst = 0;
        local_278._36_4_ = 0;
        local_278.tm_gmtoff = 0;
        local_278.tm_zone = (char *)0x0;
        booster::normalize_universal_time(&local_278);
        if (local_278.tm_mon != 2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x72);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," mon.tm_mon == 2",0x10);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (local_278.tm_year != 0x70) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x73);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," mon.tm_year == 2012 - 1900",0x1b);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (local_278.tm_mday != 0xe) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x74);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," mon.tm_mday == 14",0x12);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_278.tm_hour = 0;
        local_278.tm_mday = 0xe;
        local_278.tm_mon = -0x17;
        local_278.tm_year = 0x6f;
        local_278.tm_sec = 0;
        local_278.tm_min = 0;
        local_278.tm_wday = 0;
        local_278.tm_yday = 0;
        local_278.tm_isdst = 0;
        local_278._36_4_ = 0;
        local_278.tm_gmtoff = 0;
        local_278.tm_zone = (char *)0x0;
        booster::normalize_universal_time(&local_278);
        if (local_278.tm_mon != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," mon.tm_mon == 1",0x10);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (local_278.tm_year != 0x6d) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x7b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," mon.tm_year == 2009 - 1900",0x1b);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (local_278.tm_mday != 0xe) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x7c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," mon.tm_mday == 14",0x12);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_278.tm_hour = 0;
        local_278.tm_mday = 0x1d;
        local_278.tm_sec = 0;
        local_278.tm_min = 0;
        local_278.tm_mon = 1;
        local_278.tm_year = 0x6f;
        local_278.tm_wday = 0;
        local_278.tm_yday = 0;
        local_278.tm_isdst = 0;
        local_278._36_4_ = 0;
        local_278.tm_gmtoff = 0;
        local_278.tm_zone = (char *)0x0;
        booster::normalize_universal_time(&local_278);
        if (local_278.tm_mon == 2) {
          if (local_278.tm_year != 0x6f) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                       ,0x73);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x83);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4," mon.tm_year == 2011 - 1900",0x1b);
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (local_278.tm_mday != 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                       ,0x73);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x84);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," mon.tm_mday == 1",0x11);
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_278.tm_hour = 0;
          local_278.tm_mday = 0x1d;
          local_278.tm_sec = 0;
          local_278.tm_min = 0;
          local_278.tm_mon = 1;
          local_278.tm_year = 100;
          local_278.tm_wday = 0;
          local_278.tm_yday = 0;
          local_278.tm_isdst = 0;
          local_278._36_4_ = 0;
          local_278.tm_gmtoff = 0;
          local_278.tm_zone = (char *)0x0;
          booster::normalize_universal_time(&local_278);
          if (local_278.tm_mon != 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                       ,0x73);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x8b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," mon.tm_mon == 1",0x10);
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (local_278.tm_year == 100) {
            if (local_278.tm_mday != 0x1d) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_240,
                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                         ,0x73);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x8d);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," mon.tm_mday == 29",0x12);
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"- Testing timegm implementation",0x1f);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
            lVar6 = -0x3ae6c6cc0;
            while( true ) {
              lVar6 = lVar6 + 0xa8c0;
              booster::universal_time((long)&local_278);
              booster::universal_time((long)local_240);
              lVar3 = booster::make_universal_time(local_240);
              if (lVar6 != lVar3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                           ,0x73);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0xa1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar4," booster::make_universal_time(booster::universal_time(pt)) == pt"
                           ,0x40);
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              local_c8.tm_gmtoff = 0;
              local_c8.tm_zone = (char *)0x0;
              local_c8.tm_wday = 0;
              local_c8.tm_yday = 0;
              local_c8.tm_mon = local_278.tm_mon;
              local_c8.tm_year = local_278.tm_year;
              local_c8.tm_sec = local_278.tm_sec;
              local_c8.tm_min = local_278.tm_min;
              local_c8.tm_hour = local_278.tm_hour;
              local_c8.tm_mday = local_278.tm_mday;
              local_c8.tm_isdst = -1;
              local_c8._36_4_ = 0;
              lVar3 = booster::normalize_universal_time(&local_c8);
              if (lVar6 != lVar3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                           ,0x73);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0xaa);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar4," booster::normalize_universal_time(t_cpy) == pt",0x2f);
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar5,local_90);
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if (local_c8.tm_wday != local_278.tm_wday) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                           ,0x73);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0xab);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar4," t_cpy.tm_wday == t_ref.tm_wday",0x1f);
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar5,local_90);
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if (local_c8.tm_yday != local_278.tm_yday) break;
              if (0x3ae6b1b3f < lVar6) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                std::ostream::put(-0x58);
                std::ostream::flush();
                return 0;
              }
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                       ,0x73);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0xac);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4," t_cpy.tm_yday == t_ref.tm_yday",0x1f);
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar5,local_90);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x8c);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," mon.tm_year == 2000 - 1900",0x1b);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_240,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x82);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," mon.tm_mon == 2",0x10);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               " ptime(10, 9999990) < ptime::from_number(10.1) && ptime::from_number(10.1) <ptime(10,100000010)"
               ,0x5f);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
             ,0x73);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_240,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," 10.099999 < ptime::to_number(p) && ptime::to_number(p) < 10.10001",0x42);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,(string *)&local_278);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		using booster::ptime;

		std::cout << "- Testing ptime" << std::endl;
		ptime p;
		TEST(p==ptime::zero);
		TEST(p.get_seconds()==0 && p.get_nanoseconds()==0);
		p=ptime(10,20);
		TEST(p==ptime(10,20));
		TEST(p.get_seconds()==10 && p.get_nanoseconds()==20);
		
		p=ptime(15);
		TEST(p==ptime(15,0));
		TEST(p.get_seconds()==15 && p.get_nanoseconds()==0);


		p=ptime::milliseconds(2100);
		TEST(p.get_seconds()==2 && p.get_nanoseconds() == 100000000);
		TEST(ptime::milliseconds(p)==2100);
		TEST(p.get_milliseconds()==100);
		p=ptime::microseconds(3230000);
		TEST(p.get_seconds() == 3 && p.get_nanoseconds() == 230000000);
		TEST(ptime::microseconds(p)==3230000);
		TEST(p.get_microseconds()==230000);
		p=ptime::nanoseconds(1000000100);
		TEST(p.get_seconds()==1 && p.get_nanoseconds() == 100);
		p=ptime::seconds(15);
		TEST(p==ptime(15) && ptime::seconds(p)==15);
		p=ptime::minutes(15);
		TEST(p==ptime(15*60) && ptime::minutes(p)==15);
		p=ptime::hours(15);
		TEST(p==ptime(15*3600) && ptime::hours(p)==15);
		p=ptime::days(15);
		TEST(p==ptime(15*3600*24) && ptime::days(p)==15);
		
		p=ptime(100,1000000001);
		TEST(p.get_seconds()==101 && p.get_nanoseconds()==1);
		
		p=ptime(100,2000000001);
		TEST(p.get_seconds()==102 && p.get_nanoseconds()==1);

		p=ptime(100,2000000000);
		TEST(p.get_seconds()==102 && p.get_nanoseconds()==0);
		
		p=ptime(100,-999999999);
		TEST(p.get_seconds()==99 && p.get_nanoseconds()==1);
		
		p=ptime(100,-1999999998);
		TEST(p.get_seconds()==98 && p.get_nanoseconds()==2);

		TEST(ptime(100,0)!=ptime(101,0));
		TEST(ptime(100,1)!=ptime(100,0));
		TEST(ptime(101,1)!=ptime(100,0));
		TEST(ptime(100,3)==ptime(100,3));
		TEST(ptime(100,3)<=ptime(100,3));
		TEST(ptime(100,3)>=ptime(100,3));

		TEST(ptime(100,2)+ptime(101,3)==ptime(201,5));
		TEST(ptime(100,2)+ptime(1,999999999)==ptime(102,1));
		TEST(ptime(100,0)-ptime(1,1)==ptime(98,999999999));
		TEST(ptime(100,0)-ptime(0,999999999)==ptime(99,1));
		TEST(ptime(100,10)-ptime(1,5)==ptime(99,5));

		test_lower(ptime(100,0),ptime(101,0));
		test_lower(ptime(100,0),ptime(100,1));
		p=ptime(10,100000000);
		TEST(10.099999 < ptime::to_number(p) && ptime::to_number(p) < 10.10001);
		TEST(ptime(10, 9999990) < ptime::from_number(10.1) && ptime::from_number(10.1) <ptime(10,100000010));

		ptime start=ptime::now();
		ptime::sleep(ptime::milliseconds(100));
		ptime end = ptime::now();
		int diff = ptime::milliseconds(end-start);
		TEST(100 <= diff && diff <=300);

		std::cout << "- Testing ctime" << std::endl;
		std::cout << "- Testing timegm normalization" << std::endl;	
	
		std::tm src = std::tm();
		src.tm_year = 2011 - 1900;
		src.tm_mday = 14;
		src.tm_mon = 1; // feb

		{
			std::tm mon=src;
			mon.tm_mon+=13;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 2);
			TEST(mon.tm_year == 2012 - 1900);
			TEST(mon.tm_mday == 14);
		}
		{
			std::tm mon=src;
			mon.tm_mon-=24;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 1);
			TEST(mon.tm_year == 2009 - 1900);
			TEST(mon.tm_mday == 14);
		}
		{
			std::tm mon=src;
			mon.tm_mday+=15;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 2);
			TEST(mon.tm_year == 2011 - 1900);
			TEST(mon.tm_mday == 1);
		}
		{
			std::tm mon=src;
			mon.tm_year = 2000 - 1900;
			mon.tm_mday+=15;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 1);
			TEST(mon.tm_year == 2000 - 1900);
			TEST(mon.tm_mday == 29);
		}
	
		std::cout << "- Testing timegm implementation" << std::endl;	
		long long range = 500LL * 3600 * 24 * 366;
		if(range > std::numeric_limits<time_t>::max()) {
			range = std::numeric_limits<time_t>::max() - 3600 * 24;
		}
#ifdef BOOSTER_WIN_NATIVE
		// Under Windows localtime and gmtime are valid for positive time_t values
		// only
		long long low_point = 0;
#else
		long long low_point = -range;
#endif
		long long top_point = +range;

		for(time_t pt = low_point;pt < top_point;pt+=3600 * 12) {
			// One is system other is mine
			std::tm t_ref = booster::universal_time(pt);
			TEST(booster::make_universal_time(booster::universal_time(pt)) == pt);
			std::tm t_cpy = std::tm();
			t_cpy.tm_year = t_ref.tm_year;
			t_cpy.tm_mon = t_ref.tm_mon;
			t_cpy.tm_mday = t_ref.tm_mday;
			t_cpy.tm_hour = t_ref.tm_hour;
			t_cpy.tm_min = t_ref.tm_min;
			t_cpy.tm_sec = t_ref.tm_sec;
			t_cpy.tm_isdst = -1;
			TEST(booster::normalize_universal_time(t_cpy) == pt);
			TEST(t_cpy.tm_wday == t_ref.tm_wday);
			TEST(t_cpy.tm_yday == t_ref.tm_yday);
		}



	}
	catch(std::exception const &e) {
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
}